

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaBasicItemPtr
xmlSchemaGetNamedComponent
          (xmlSchemaPtr schema,xmlSchemaTypeType itemType,xmlChar *name,xmlChar *targetNs)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *targetNs_local;
  xmlChar *name_local;
  xmlSchemaTypeType itemType_local;
  xmlSchemaPtr schema_local;
  
  if (itemType == XML_SCHEMA_TYPE_ELEMENT) {
    schema_local = (xmlSchemaPtr)xmlSchemaGetElem(schema,name,targetNs);
  }
  else if (itemType == XML_SCHEMA_TYPE_GROUP) {
    schema_local = (xmlSchemaPtr)xmlSchemaGetGroup(schema,name,targetNs);
  }
  else {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
              ,0x13ca);
    schema_local = (xmlSchemaPtr)0x0;
  }
  return (xmlSchemaBasicItemPtr)schema_local;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaGetNamedComponent(xmlSchemaPtr schema,
			   xmlSchemaTypeType itemType,
			   const xmlChar *name,
			   const xmlChar *targetNs)
{
    switch (itemType) {
	case XML_SCHEMA_TYPE_GROUP:
	    return ((xmlSchemaBasicItemPtr) xmlSchemaGetGroup(schema,
		name, targetNs));
	case XML_SCHEMA_TYPE_ELEMENT:
	    return ((xmlSchemaBasicItemPtr) xmlSchemaGetElem(schema,
		name, targetNs));
	default:
	    TODO
	    return (NULL);
    }
}